

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

QLatin1StringView __thiscall QHttpHeaders::nameAt(QHttpHeaders *this,qsizetype i)

{
  Header *pHVar1;
  long lVar2;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  anon_class_1_0_00000001 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar1 = (((this->d).d.ptr)->headers).d.ptr;
  lVar2 = (long)(char)*(__index_type *)
                       ((long)&pHVar1[i].name.data.
                               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray> +
                       0x18);
  if (lVar2 == -1) {
    abort();
  }
  QVar3 = (QLatin1StringView)
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<QByteArrayView>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qhttpheaders.cpp:731:27)_&&,_const_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
            ::_S_vtable._M_arr[lVar2]._M_data)
                    (&local_9,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)(pHVar1 + i));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

const noexcept
{
    verify(i);
    return QLatin1StringView{d->headers.at(i).name.asView()};
}